

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O2

int csp_eth_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  uint8_t *mac_addr;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if ((packet->id).dst == iface->addr) {
    csp_qfifo_write(packet,iface,(void *)0x0);
  }
  else {
    pvVar3 = iface->interface_data;
    csp_id_prepend(packet);
    csp_eth_tx::packet_id = csp_eth_tx::packet_id + 1;
    for (uVar6 = 0; (ushort)uVar6 < packet->frame_length; uVar6 = uVar6 + iVar5) {
      mac_addr = *(uint8_t **)((long)pvVar3 + 0x70);
      uVar4 = *(ushort *)((long)pvVar3 + 0x62) - 0x16;
      uVar7 = packet->frame_length - uVar6;
      if ((ushort)uVar4 <= (ushort)uVar7) {
        uVar7 = uVar4;
      }
      mac_addr[0xc] = 0x88;
      mac_addr[0xd] = 0xb5;
      csp_eth_arp_get_addr(mac_addr,(packet->id).dst);
      *(undefined2 *)(mac_addr + 10) = *(undefined2 *)((long)pvVar3 + 0x84);
      *(undefined4 *)(mac_addr + 6) = *(undefined4 *)((long)pvVar3 + 0x80);
      uVar1 = packet->frame_length;
      uVar2 = (packet->id).src;
      *(uint16_t *)(mac_addr + 0xe) = csp_eth_tx::packet_id << 8 | csp_eth_tx::packet_id >> 8;
      *(ushort *)(mac_addr + 0x10) = uVar2 << 8 | uVar2 >> 8;
      *(ushort *)(mac_addr + 0x12) = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
      *(ushort *)(mac_addr + 0x14) = uVar1 << 8 | uVar1 >> 8;
      memcpy(mac_addr + 0x16,packet->frame_begin + (uVar6 & 0xffff),(ulong)uVar7 & 0xffff);
      iVar5 = (**(code **)((long)pvVar3 + 0x68))(iface->driver_data,mac_addr);
      if (iVar5 != 0) {
        iface->tx_error = iface->tx_error + 1;
        return -0xb;
      }
      iVar5 = (int)((ulong)uVar7 & 0xffff);
      if (eth_debug == true) {
        csp_hex_dump("tx",mac_addr,(uVar6 & 0xffff) + iVar5 + 0x16);
      }
    }
    csp_buffer_free(packet);
  }
  return 0;
}

Assistant:

int csp_eth_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    /* Loopback */
    if (packet->id.dst == iface->addr) {
        csp_qfifo_write(packet, iface, NULL);
        return CSP_ERR_NONE;
    }

    csp_id_prepend(packet);

    static uint16_t packet_id = 0;
    packet_id++;
    uint16_t offset = 0;

    while (offset < packet->frame_length) {

        csp_eth_header_t *eth_frame = ifdata->tx_buf;

        const uint16_t seg_size_max = ifdata->tx_mtu - sizeof(csp_eth_header_t);
        uint16_t seg_size = packet->frame_length - offset;
        if (seg_size > seg_size_max) {
            seg_size = seg_size_max;
        }

        eth_frame->ether_type = htobe16(CSP_ETH_TYPE_CSP);
        csp_eth_arp_get_addr(eth_frame->ether_dhost, packet->id.dst);
        memcpy(eth_frame->ether_shost, ifdata->if_mac, CSP_ETH_ALEN);

        csp_eth_pack_header(eth_frame, packet_id, packet->id.src, seg_size, packet->frame_length);

        memcpy(eth_frame->frame_begin, packet->frame_begin + offset, seg_size);

		if ((ifdata->tx_func)(iface->driver_data, eth_frame) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
        }

        if (eth_debug) csp_hex_dump("tx", eth_frame, sizeof(csp_eth_header_t) + offset + seg_size);

        offset += seg_size;
    }

    csp_buffer_free(packet);
    return CSP_ERR_NONE;
}